

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_oct(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  basic_format_specs<char> *specs;
  ulong uVar4;
  ulong uVar5;
  anon_class_16_2_cb75083a_for_f_conflict1 f;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar6;
  int num_digits;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  string_view prefix;
  undefined4 uStack_c;
  
  uVar2 = (ulong)this->abs_value;
  uVar3 = *(ulong *)((long)&this->abs_value + 8);
  num_digits = 0;
  uVar7 = uVar3;
  uVar8 = uVar2;
  do {
    uVar4 = uVar7 << 0x3d;
    num_digits = num_digits + 1;
    bVar9 = 7 < uVar8;
    bVar10 = uVar7 != 0;
    uVar5 = -uVar7;
    uVar7 = uVar7 >> 3;
    uVar8 = uVar4 | uVar8 >> 3;
  } while (bVar10 || uVar5 < bVar9);
  specs = this->specs;
  if (((char)specs->field_0x9 < '\0') &&
     ((uVar2 != 0 || uVar3 != 0) && specs->precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.this = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  bVar6 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_oct()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    ((this->out).container,num_digits,prefix,specs,f);
  (this->out).container = bVar6.container;
  return;
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }